

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexst.cpp
# Opt level: O2

void icu_63::initStaticSets(UErrorCode *status)

{
  RegexStaticSets *this;
  code *p;
  
  p = regex_cleanup;
  ucln_i18n_registerCleanup_63(UCLN_I18N_REGEX,regex_cleanup);
  this = (RegexStaticSets *)UMemory::operator_new((UMemory *)0x5e0,(size_t)p);
  if (this == (RegexStaticSets *)0x0) {
    RegexStaticSets::gStaticSets = this;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0026b7da;
  }
  else {
    p = (code *)status;
    RegexStaticSets::RegexStaticSets(this,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      RegexStaticSets::gStaticSets = this;
      return;
    }
    RegexStaticSets::gStaticSets = this;
    RegexStaticSets::~RegexStaticSets(this);
  }
  UMemory::operator_delete((UMemory *)this,p);
  if (U_ZERO_ERROR < *status) {
    RegexStaticSets::gStaticSets = (RegexStaticSets *)0x0;
    return;
  }
LAB_0026b7da:
  RegexStaticSets::gStaticSets = (RegexStaticSets *)0x0;
  *status = U_MEMORY_ALLOCATION_ERROR;
  return;
}

Assistant:

static void U_CALLCONV initStaticSets(UErrorCode &status) {
    U_ASSERT(RegexStaticSets::gStaticSets == NULL);
    ucln_i18n_registerCleanup(UCLN_I18N_REGEX, regex_cleanup);
    RegexStaticSets::gStaticSets = new RegexStaticSets(&status);
    if (U_FAILURE(status)) {
        delete RegexStaticSets::gStaticSets;
        RegexStaticSets::gStaticSets = NULL;
    }
    if (RegexStaticSets::gStaticSets == NULL && U_SUCCESS(status)) {
        status = U_MEMORY_ALLOCATION_ERROR;
    }
}